

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * ts2string_abi_cxx11_(time_t t)

{
  tm *in_RDI;
  tm tm;
  char szBuf [50];
  time_t *in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char local_48 [72];
  
  gmtime_s(in_RDI,in_stack_ffffffffffffff38);
  strftime(local_48,0x31,"%Y-%m-%d %H:%M:%S",(tm *)&stack0xffffffffffffff80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return (string *)in_RDI;
}

Assistant:

std::string ts2string (time_t t)
{
    // format it nicely
    char szBuf[50];
    struct tm tm;
    gmtime_s(&tm, &t);
    strftime(szBuf,
             sizeof(szBuf) - 1,
             "%Y-%m-%d %H:%M:%S",       // %F %T
             &tm);
    return std::string(szBuf);
}